

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_cache.cc
# Opt level: O0

void * __thiscall
tcmalloc::ThreadCache::FetchFromCentralCache
          (ThreadCache *this,uint32_t cl,int32_t byte_size,_func_void_ptr_size_t *oom_handler)

{
  FreeList *pFVar1;
  int N;
  SizeMap *this_00;
  size_t sVar2;
  int *piVar3;
  CentralFreeList *pCVar4;
  void *start_00;
  int local_5c;
  int local_58;
  int local_54;
  int new_length;
  int fetch_count;
  void *end;
  void *start;
  int local_38;
  int local_34;
  int num_to_move;
  int batch_size;
  FreeList *list;
  _func_void_ptr_size_t *oom_handler_local;
  int32_t byte_size_local;
  uint32_t cl_local;
  ThreadCache *this_local;
  
  _num_to_move = this->list_ + cl;
  list = (FreeList *)oom_handler;
  oom_handler_local._0_4_ = byte_size;
  oom_handler_local._4_4_ = cl;
  _byte_size_local = this;
  this_00 = Static::sizemap();
  local_34 = SizeMap::num_objects_to_move(this_00,oom_handler_local._4_4_);
  sVar2 = FreeList::max_length(_num_to_move);
  start._4_4_ = (undefined4)sVar2;
  piVar3 = std::min<int>((int *)((long)&start + 4),&local_34);
  local_38 = *piVar3;
  pCVar4 = Static::central_cache();
  local_54 = CentralFreeList::RemoveRange
                       (pCVar4 + oom_handler_local._4_4_,&end,(void **)&new_length,local_38);
  pFVar1 = _num_to_move;
  if (local_54 == 0) {
    this_local = (ThreadCache *)(*(code *)list)((long)(int32_t)oom_handler_local);
  }
  else {
    N = local_54 + -1;
    local_54 = N;
    if (-1 < N) {
      this->size_ = (int32_t)oom_handler_local * N + this->size_;
      start_00 = SLL_Next(end);
      FreeList::PushRange(pFVar1,N,start_00,_new_length);
    }
    sVar2 = FreeList::max_length(_num_to_move);
    pFVar1 = _num_to_move;
    if (sVar2 < (ulong)(long)local_34) {
      sVar2 = FreeList::max_length(_num_to_move);
      FreeList::set_max_length(pFVar1,sVar2 + 1);
    }
    else {
      sVar2 = FreeList::max_length(_num_to_move);
      local_5c = (int)sVar2 + local_34;
      piVar3 = std::min<int>(&local_5c,&kMaxDynamicFreeListLength);
      local_58 = *piVar3 - *piVar3 % local_34;
      FreeList::set_max_length(_num_to_move,(long)local_58);
    }
    this_local = (ThreadCache *)end;
  }
  return this_local;
}

Assistant:

void* ThreadCache::FetchFromCentralCache(uint32_t cl, int32_t byte_size,
                                         void *(*oom_handler)(size_t size)) {
  FreeList* list = &list_[cl];
  ASSERT(list->empty());
  const int batch_size = Static::sizemap()->num_objects_to_move(cl);

  const int num_to_move = std::min<int>(list->max_length(), batch_size);
  void *start, *end;
  int fetch_count = Static::central_cache()[cl].RemoveRange(
      &start, &end, num_to_move);

  if (fetch_count == 0) {
    ASSERT(start == nullptr);
    return oom_handler(byte_size);
  }
  ASSERT(start != nullptr);

  if (--fetch_count >= 0) {
    size_ += byte_size * fetch_count;
    list->PushRange(fetch_count, SLL_Next(start), end);
  }

  // Increase max length slowly up to batch_size.  After that,
  // increase by batch_size in one shot so that the length is a
  // multiple of batch_size.
  if (list->max_length() < batch_size) {
    list->set_max_length(list->max_length() + 1);
  } else {
    // Don't let the list get too long.  In 32 bit builds, the length
    // is represented by a 16 bit int, so we need to watch out for
    // integer overflow.
    int new_length = std::min<int>(list->max_length() + batch_size,
                              kMaxDynamicFreeListLength);
    // The list's max_length must always be a multiple of batch_size,
    // and kMaxDynamicFreeListLength is not necessarily a multiple
    // of batch_size.
    new_length -= new_length % batch_size;
    ASSERT(new_length % batch_size == 0);
    list->set_max_length(new_length);
  }
  return start;
}